

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriHelper.cpp
# Opt level: O2

Var Js::UriHelper::Encode
              (JavascriptString *strURI,uchar unescapedFlags,ScriptContext *scriptContext)

{
  byte bVar1;
  char16 cVar2;
  code *pcVar3;
  undefined8 content;
  bool bVar4;
  charcount_t cVar5;
  BOOL BVar6;
  BYTE lhs [4];
  char16 *pcVar7;
  Recycler *this;
  char16_t *pcVar8;
  undefined4 *puVar9;
  JavascriptString *pJVar10;
  ulong uVar11;
  uint32 uVar12;
  int32 hCode;
  uint uVar13;
  undefined1 local_80 [8];
  TrackAllocData data;
  byte local_48 [4];
  uint local_44;
  BYTE bUTF8 [4];
  
  cVar5 = JavascriptString::GetLength(strURI);
  data._32_8_ = strURI;
  pcVar7 = JavascriptString::GetString(strURI);
  local_44 = (uint)unescapedFlags;
  lhs[0] = '\0';
  lhs[1] = '\0';
  lhs[2] = '\0';
  lhs[3] = '\0';
  bVar4 = false;
  for (uVar13 = 0; pJVar10 = (JavascriptString *)data._32_8_, uVar13 < cVar5; uVar13 = uVar13 + 1) {
    cVar2 = pcVar7[uVar13];
    uVar12 = (uint32)(ushort)cVar2;
    BVar6 = InURISet(cVar2,(uchar)local_44);
    if (BVar6 == 0) {
      if ((cVar2 & 0xfc00U) == 0xdc00) {
LAB_00c14bdc:
        hCode = -0x7ff5ec60;
        goto LAB_00c14bf0;
      }
      if (0xfbff < (ushort)(cVar2 + L'␀')) {
        uVar13 = uVar13 + 1;
        if ((uVar13 == cVar5) || ((ushort)(pcVar7[uVar13] + L'\x2000') < 0xfc00)) goto LAB_00c14bdc;
        uVar12 = (uint)(ushort)cVar2 * 0x400 + (uint)(ushort)pcVar7[uVar13] + 0xfca02400;
      }
      uVar12 = ToUTF8(uVar12,local_48);
      uVar12 = uVar12 * 3;
      bVar4 = true;
    }
    else {
      uVar12 = 1;
    }
    lhs = (BYTE  [4])UInt32Math::Add((uint32)lhs,uVar12);
  }
  if (bVar4) {
    uVar12 = UInt32Math::Add((uint32)lhs,1);
    local_80 = (undefined1  [8])&char16_t::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_912414c;
    data.filename._0_4_ = 0xbf;
    data.plusSize = (ulong)uVar12;
    this = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_80);
    pcVar8 = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                       ((Memory *)this,(Recycler *)Memory::Recycler::AllocLeaf,0,(ulong)uVar12);
    data._32_8_ = pcVar8;
    bUTF8 = lhs;
    for (uVar13 = 0; content = data._32_8_, uVar13 < cVar5; uVar13 = uVar13 + 1) {
      cVar2 = pcVar7[uVar13];
      uVar12 = (uint32)(ushort)cVar2;
      BVar6 = InURISet(cVar2,(uchar)local_44);
      lhs = bUTF8;
      if (BVar6 == 0) {
        if ((cVar2 & 0xfc00U) == 0xdc00) {
LAB_00c14be7:
          hCode = -0x7ff5ffcd;
LAB_00c14bf0:
          JavascriptError::ThrowURIError(scriptContext,hCode,(PCWSTR)0x0);
        }
        if (0xfbff < (ushort)(cVar2 + L'␀')) {
          uVar13 = uVar13 + 1;
          if ((uVar13 == cVar5) || ((ushort)(pcVar7[uVar13] + L'\x2000') < 0xfc00))
          goto LAB_00c14be7;
          uVar12 = (uint)(ushort)cVar2 * 0x400 + (uint)(ushort)pcVar7[uVar13] + 0xfca02400;
        }
        uVar12 = ToUTF8(uVar12,local_48);
        for (uVar11 = 0; uVar12 != uVar11; uVar11 = uVar11 + 1) {
          bVar1 = local_48[uVar11];
          *pcVar8 = L'%';
          pcVar8[1] = L"0123456789ABCDEF"[bVar1 >> 4];
          pcVar8[2] = L"0123456789ABCDEF"[bVar1 & 0xf];
          pcVar8 = pcVar8 + 3;
        }
      }
      else {
        *pcVar8 = cVar2;
        pcVar8 = pcVar8 + 1;
      }
    }
    pcVar7 = (char16 *)((ulong)(uint)lhs * 2 + data._32_8_);
    if (pcVar7 != pcVar8) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/UriHelper.cpp"
                                  ,0xf9,"(outURI + outputLen == outCurrent)",
                                  " URI out buffer out of sync");
      if (!bVar4) {
LAB_00c14bf7:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar9 = 0;
    }
    *pcVar7 = L'\0';
    pJVar10 = JavascriptString::NewWithBuffer((char16 *)content,(charcount_t)lhs,scriptContext);
  }
  else if (*(ScriptContext **)(*(long *)(*(long *)(data._32_8_ + 8) + 8) + 0x490) != scriptContext)
  {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/UriHelper.cpp"
                                ,0xb8,"(scriptContext == strURI->GetScriptContext())",
                                "Should have already marshaled the string in cross site thunk");
    if (!bVar4) goto LAB_00c14bf7;
    *puVar9 = 0;
  }
  return pJVar10;
}

Assistant:

Var UriHelper::Encode(JavascriptString* strURI, unsigned char unescapedFlags, ScriptContext* scriptContext )
    {
        charcount_t len = strURI->GetLength();
        __in_ecount(len) const char16* input = strURI->GetString();
        bool needsChanges = false;
        BYTE bUTF8[MaxUTF8Len];

        // pass 1 calculate output length and error check
        uint32 outputLen = 0;
        for( uint32 k = 0; k < len; k++ )
        {
            char16 c = input[k];
            uint32 uVal;
            if( InURISet(c, unescapedFlags) )
            {
                outputLen = UInt32Math::Add(outputLen, 1);
            }
            else
            {
                needsChanges = true;

                if( c >= 0xDC00 && c <= 0xDFFF )
                {
                    JavascriptError::ThrowURIError(scriptContext, JSERR_URIEncodeError /* TODO-ERROR: _u("NEED MESSAGE") */);
                }
                else if( c < 0xD800 || c > 0xDBFF )
                {
                    uVal = (uint32)c;
                }
                else
                {
                    ++k;
                    if(k == len)
                    {
                        JavascriptError::ThrowURIError(scriptContext, JSERR_URIEncodeError /* TODO-ERROR: _u("NEED MESSAGE") */);
                    }
                    __analysis_assume(k < len); // because we throw exception if k==len
                    char16 c1 = input[k];
                    if( c1 < 0xDC00 || c1 > 0xDFFF )
                    {
                        JavascriptError::ThrowURIError(scriptContext, JSERR_URIEncodeError /* TODO-ERROR: _u("NEED MESSAGE") */);
                    }
                    uVal = (c - 0xD800) * 0x400 + (c1 - 0xDC00) + 0x10000;
                }
                uint32 utfLen = ToUTF8(uVal, bUTF8);
                utfLen = UInt32Math::Mul(utfLen, 3);
                outputLen = UInt32Math::Add(outputLen, utfLen);
            }
        }

        // If nothing needs encoding, then avoid extra work
        if (!needsChanges)
        {
            AssertMsg(scriptContext == strURI->GetScriptContext(), "Should have already marshaled the string in cross site thunk");
            return strURI;
        }

        //pass 2 generate the encoded URI

        uint32 allocSize = UInt32Math::Add(outputLen, 1);
        char16* outURI = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, allocSize);
        char16* outCurrent = outURI;
        const char16 *hexStream = _u("0123456789ABCDEF");

        for( uint32 k = 0; k < len; k++ )
        {
            char16 c = input[k];
            uint32 uVal;
            if( InURISet(c, unescapedFlags) )
            {
                __analysis_assume(outCurrent < outURI + allocSize);
                *outCurrent++ = c;
            }
            else
            {
#if DBG
                if( c >= 0xDC00 && c <= 0xDFFF )
                {
                    JavascriptError::ThrowURIError(scriptContext, VBSERR_InternalError /* TODO-ERROR: _u("NEED MESSAGE") */);
                }
#endif
                if( c < 0xD800 || c > 0xDBFF )
                {
                    uVal = (uint32)c;
                }
                else
                {
                    ++k;
#if DBG
                    if(k == len)
                    {
                        JavascriptError::ThrowURIError(scriptContext, VBSERR_InternalError /* TODO-ERROR: _u("NEED MESSAGE") */);
                    }
#endif
                    __analysis_assume(k < len);// because we throw exception if k==len
                    char16 c1 = input[k];

#if DBG
                    if( c1 < 0xDC00 || c1 > 0xDFFF )
                    {
                        JavascriptError::ThrowURIError(scriptContext, VBSERR_InternalError /* TODO-ERROR: _u("NEED MESSAGE") */);
                    }
#endif
                    uVal = (c - 0xD800) * 0x400 + (c1 - 0xDC00) + 0x10000;
                }

                uint32 utfLen = ToUTF8(uVal, bUTF8);
                for( uint32 j = 0; j < utfLen; j++ )
                {
#pragma prefast(disable: 26014, "buffer length was calculated earlier");
                    BYTE val = bUTF8[j];
                    *outCurrent++ = _u('%');
                    *outCurrent++ = hexStream[(val >> 4)];
                    *outCurrent++ = hexStream[(val & 0xF)];
#pragma prefast(default: 26014);
                }
            }
        }
        AssertMsg(outURI + outputLen == outCurrent, " URI out buffer out of sync");
        __analysis_assume(outputLen + 1 == allocSize);
        outURI[outputLen] = _u('\0');

        return JavascriptString::NewWithBuffer(outURI, outputLen, scriptContext);
    }